

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O2

void adjust_panel_help(wchar_t y,wchar_t x,_Bool help,player *p,wchar_t mode,point_set **targets,
                      _Bool *show_interesting,int *target_index)

{
  int iVar1;
  term_conflict *t;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  point_set *ppVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  byte bVar12;
  wchar_t wVar13;
  int iVar14;
  long lVar15;
  
  iVar6 = row_top_map[Term->sidebar_mode];
  iVar14 = Term->hgt + -2;
  if ((int)CONCAT71(in_register_00000011,help) == 0) {
    iVar14 = Term->hgt;
  }
  iVar1 = row_bottom_map[Term->sidebar_mode];
  lVar15 = 0;
  bVar12 = 0;
  do {
    if (lVar15 == 8) {
      if ((bVar12 != 0) && (handle_stuff(p), targets != (point_set **)0x0)) {
        point_set_dispose((point_set_conflict *)*targets);
        ppVar7 = target_get_monsters(mode,(monster_predicate)0x0,true);
        *targets = ppVar7;
      }
      if (target_index != (int *)0x0 && show_interesting != (_Bool *)0x0) {
        *show_interesting = false;
        ppVar7 = *targets;
        for (lVar15 = 0; iVar6 = point_set_size((point_set_conflict *)ppVar7), lVar15 < iVar6;
            lVar15 = lVar15 + 1) {
          ppVar7 = *targets;
          if ((ppVar7->pts[lVar15].y == y) && (ppVar7->pts[lVar15].x == x)) {
            *target_index = (int)lVar15;
            *show_interesting = true;
            return;
          }
        }
      }
      return;
    }
    t = (term_conflict *)angband_term[lVar15];
    if (t != (term_conflict *)0x0) {
      if (lVar15 == 0) {
        wVar8 = ~col_map[Term->sidebar_mode] + Term->wid;
        wVar9 = iVar14 - (iVar6 + iVar1);
      }
      else {
        if ((window_flag[lVar15] & 0x80) == 0) goto LAB_001f7d90;
        wVar8 = t->wid;
        wVar9 = t->hgt;
      }
      iVar4 = wVar9 / (int)(uint)tile_height;
      iVar5 = iVar4 / 2;
      iVar10 = t->offset_y - iVar5;
      wVar9 = t->offset_y;
      do {
        wVar13 = wVar9;
        iVar10 = iVar10 + iVar5;
        wVar9 = wVar13 + iVar5;
      } while (iVar4 + iVar10 <= y);
      wVar13 = wVar13 - iVar4 / -2;
      do {
        wVar13 = wVar13 + iVar4 / -2;
      } while (y < wVar13);
      uVar2 = (long)wVar8 / (long)(int)(uint)tile_width;
      uVar11 = (int)uVar2 >> 0x1f;
      iVar4 = (int)((long)((ulong)uVar11 << 0x20 | uVar2 & 0xffffffff) / 2);
      iVar5 = t->offset_x - iVar4;
      wVar8 = t->offset_x;
      do {
        wVar9 = wVar8;
        iVar5 = iVar5 + iVar4;
        wVar8 = wVar9 + iVar4;
      } while ((int)uVar2 + iVar5 <= x);
      iVar4 = (int)((long)((ulong)uVar11 << 0x20 | uVar2 & 0xffffffff) / -2);
      wVar9 = wVar9 - iVar4;
      do {
        wVar9 = wVar9 + iVar4;
      } while (x < wVar9);
      _Var3 = modify_panel(t,wVar13,wVar9);
      bVar12 = bVar12 | _Var3;
    }
LAB_001f7d90:
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

static void adjust_panel_help(int y, int x, bool help,
		struct player *p, int mode, struct point_set **targets,
		bool *show_interesting, int *target_index)
{
	bool changed = false;

	int j;

	int screen_hgt_main = help ? (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP - 2)
			 : (Term->hgt - ROW_MAP - ROW_BOTTOM_MAP);

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
	{
		int wx, wy;
		int screen_hgt, screen_wid;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		wy = t->offset_y;
		wx = t->offset_x;

		screen_hgt = (j == 0) ? screen_hgt_main : t->hgt;
		screen_wid = (j == 0) ? (Term->wid - COL_MAP - 1) : t->wid;

		/* Bigtile panels need adjustment */
		screen_wid = screen_wid / tile_width;
		screen_hgt = screen_hgt / tile_height;

		/* Adjust as needed */
		while (y >= wy + screen_hgt) wy += screen_hgt / 2;
		while (y < wy) wy -= screen_hgt / 2;

		/* Adjust as needed */
		while (x >= wx + screen_wid) wx += screen_wid / 2;
		while (x < wx) wx -= screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	if (changed) {
		handle_stuff(p);
		if (targets) {
			/* Recalculate interesting grids */
			point_set_dispose(*targets);
			*targets = target_get_monsters(mode, NULL, true);
		}
	}

	if (show_interesting && target_index) {
		/* Turn interesting mode off if they clicked a boring spot... */
		*show_interesting = false;

		/* ...but turn it on if they clicked an interesting spot */
		for (j = 0; j < point_set_size(*targets); j++) {
			if (y == (*targets)->pts[j].y
					&& x == (*targets)->pts[j].x) {
				*target_index = j;
				*show_interesting = true;
				break;
			}
		}
	}
}